

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::mark_struct_members_packed(CompilerMSL *this,SPIRType *type)

{
  bool bVar1;
  SPIRType *type_00;
  ulong uVar2;
  ulong uVar3;
  
  Compiler::set_extended_decoration
            ((Compiler *)this,(type->super_IVariant).self.id,SPIRVCrossDecorationPhysicalTypePacked,
             0);
  uVar2 = (ulong)(uint)(type->member_types).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      type_00 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr +
                           (type->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar3]
                           .id);
      if (*(int *)&(type_00->super_IVariant).field_0xc == 0xf) {
        while ((type_00->array).super_VectorView<unsigned_int>.buffer_size != 0) {
          type_00 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr +
                               (type_00->parent_type).id);
        }
        mark_struct_members_packed(this,type_00);
      }
      else {
        bVar1 = Compiler::is_scalar((Compiler *)this,type_00);
        if (!bVar1) {
          Compiler::set_extended_member_decoration
                    ((Compiler *)this,(type->super_IVariant).self.id,(uint32_t)uVar3,
                     SPIRVCrossDecorationPhysicalTypePacked,0);
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar2);
  }
  return;
}

Assistant:

void CompilerMSL::mark_struct_members_packed(const SPIRType &type)
{
	set_extended_decoration(type.self, SPIRVCrossDecorationPhysicalTypePacked);

	// Problem case! Struct needs to be placed at an awkward alignment.
	// Mark every member of the child struct as packed.
	uint32_t mbr_cnt = uint32_t(type.member_types.size());
	for (uint32_t i = 0; i < mbr_cnt; i++)
	{
		auto &mbr_type = get<SPIRType>(type.member_types[i]);
		if (mbr_type.basetype == SPIRType::Struct)
		{
			// Recursively mark structs as packed.
			auto *struct_type = &mbr_type;
			while (!struct_type->array.empty())
				struct_type = &get<SPIRType>(struct_type->parent_type);
			mark_struct_members_packed(*struct_type);
		}
		else if (!is_scalar(mbr_type))
			set_extended_member_decoration(type.self, i, SPIRVCrossDecorationPhysicalTypePacked);
	}
}